

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O1

bool __thiscall
OSSLAES::wrapUnwrapKey
          (OSSLAES *this,SymmetricKey *key,Type mode,ByteString *in,ByteString *out,int wrap)

{
  ByteString *this_00;
  int iVar1;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  undefined4 extraout_var;
  uchar *puVar2;
  size_t sVar3;
  uchar *in_00;
  char *pcVar4;
  char *format;
  long lVar5;
  bool bVar6;
  int curBlockLen;
  int local_44;
  ByteString *local_40;
  long local_38;
  
  pcVar4 = "";
  if (wrap == 0) {
    pcVar4 = "un";
  }
  cipher = (EVP_CIPHER *)getWrapCipher(this,mode,key);
  if (cipher == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"wrapUnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0x9a,"Failed to get EVP %swrap cipher",pcVar4);
    return false;
  }
  local_40 = out;
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    softHSMLog(3,"wrapUnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0xa2,"Failed to allocate space for EVP_CIPHER_CTX");
    return false;
  }
  EVP_CIPHER_CTX_set_flags(ctx,1);
  iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[4])(key);
  puVar2 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var,iVar1));
  iVar1 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,puVar2,(uchar *)0x0,wrap);
  if ((iVar1 == 0) || (iVar1 = EVP_CIPHER_CTX_set_padding(ctx,0), iVar1 == 0)) {
    format = "Failed to initialise EVP cipher %swrap operation";
    bVar6 = false;
    iVar1 = 0xad;
  }
  else {
    local_38 = 0;
    sVar3 = ByteString::size(in);
    iVar1 = EVP_CIPHER_CTX_get_block_size(ctx);
    this_00 = local_40;
    ByteString::resize(local_40,(sVar3 + (long)(iVar1 * 2)) - 1);
    local_44 = 0;
    puVar2 = ByteString::operator[](this_00,0);
    in_00 = ByteString::const_byte_str(in);
    sVar3 = ByteString::size(in);
    iVar1 = EVP_CipherUpdate(ctx,puVar2,&local_44,in_00,(int)sVar3);
    bVar6 = false;
    if (iVar1 == 1) {
      lVar5 = (long)local_44;
      puVar2 = ByteString::operator[](local_40,0);
      local_38 = lVar5;
      iVar1 = EVP_CipherFinal_ex(ctx,puVar2 + lVar5,&local_44);
      bVar6 = iVar1 == 1;
    }
    if (bVar6) {
      EVP_CIPHER_CTX_free(ctx);
      ByteString::resize(local_40,(long)(int)local_38 + (long)local_44);
      return bVar6;
    }
    format = "Failed EVP %swrap operation";
    iVar1 = 0xbe;
  }
  softHSMLog(3,"wrapUnwrapKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
             ,iVar1,format,pcVar4);
  EVP_CIPHER_CTX_free(ctx);
  return bVar6;
}

Assistant:

bool OSSLAES::wrapUnwrapKey(const SymmetricKey* key, const SymWrap::Type mode, const ByteString& in, ByteString& out, const int wrap) const
{
	const char *prefix = "";
	if (wrap == 0)
		prefix = "un";

	// Determine the cipher method
	const EVP_CIPHER* cipher = getWrapCipher(mode, key);
	if (cipher == NULL)
	{
		ERROR_MSG("Failed to get EVP %swrap cipher", prefix);
		return false;
	}

	// Allocate the EVP context
	EVP_CIPHER_CTX* pWrapCTX = EVP_CIPHER_CTX_new();
	if (pWrapCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");
		return false;
	}
	EVP_CIPHER_CTX_set_flags(pWrapCTX, EVP_CIPHER_CTX_FLAG_WRAP_ALLOW);

	int rv = EVP_CipherInit_ex(pWrapCTX, cipher, NULL, (unsigned char*) key->getKeyBits().const_byte_str(), NULL, wrap);
	if (rv)
		// Padding is handled by cipher mode separately
		rv = EVP_CIPHER_CTX_set_padding(pWrapCTX, 0);
	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP cipher %swrap operation", prefix);

		EVP_CIPHER_CTX_free(pWrapCTX);
		return false;
	}

	// 1 input byte could be expanded to two AES blocks
	out.resize(in.size() + 2 * EVP_CIPHER_CTX_block_size(pWrapCTX) - 1);
	int outLen = 0;
	int curBlockLen = 0;
	rv = EVP_CipherUpdate(pWrapCTX, &out[0], &curBlockLen, in.const_byte_str(), in.size());
	if (rv == 1) {
		outLen = curBlockLen;
		rv = EVP_CipherFinal_ex(pWrapCTX, &out[0] + outLen, &curBlockLen);
	}
	if (rv != 1)
	{
		ERROR_MSG("Failed EVP %swrap operation", prefix);

		EVP_CIPHER_CTX_free(pWrapCTX);
		return false;
	}
	EVP_CIPHER_CTX_free(pWrapCTX);
	outLen += curBlockLen;
	out.resize(outLen);
	return true;
}